

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O0

RABlockVisitItem __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlockVisitItem>::pop
          (ZoneStack<asmjit::v1_14::RABlockVisitItem> *this)

{
  long lVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  ulong middleIndex;
  ZoneStackBase *in_RDI;
  RABlockVisitItem RVar4;
  RABlockVisitItem *ptr;
  Block *block;
  RABlockVisitItem item;
  char *in_stack_00000380;
  int in_stack_0000038c;
  char *in_stack_00000390;
  ZoneStackBase *in_stack_ffffffffffffff88;
  ZoneStackBase *this_00;
  
  if (*(long *)in_RDI == 0) {
    DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
  }
  this_00 = in_RDI;
  bVar3 = ZoneStackBase::empty(in_stack_ffffffffffffff88);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
  }
  lVar1 = *(long *)(in_RDI + 0x10);
  if (*(long *)(lVar1 + 0x10) == *(long *)(lVar1 + 0x18)) {
    DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
  }
  middleIndex = *(long *)(lVar1 + 0x18) - 0x10;
  auVar2 = *(undefined1 (*) [12])(*(long *)(lVar1 + 0x18) + -0x10);
  if (middleIndex < lVar1 + 0x20U) {
    DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
  }
  if (middleIndex < *(ulong *)(lVar1 + 0x10)) {
    DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
  }
  *(ulong *)(lVar1 + 0x18) = middleIndex;
  if (*(long *)(lVar1 + 0x10) == *(long *)(lVar1 + 0x18)) {
    ZoneStackBase::_cleanupBlock(this_00,(uint32_t)((ulong)lVar1 >> 0x20),middleIndex);
  }
  RVar4._12_4_ = 0;
  RVar4._0_12_ = auVar2;
  return RVar4;
}

Assistant:

inline T pop() noexcept {
    ASMJIT_ASSERT(isInitialized());
    ASMJIT_ASSERT(!empty());

    Block* block = _block[kBlockIndexLast];
    ASMJIT_ASSERT(!block->empty());

    T* ptr = block->end<T>();
    T item = *--ptr;
    ASMJIT_ASSERT(ptr >= block->data<T>());
    ASMJIT_ASSERT(ptr >= block->start<T>());

    block->setEnd(ptr);
    if (block->empty())
      _cleanupBlock(kBlockIndexLast, kMidBlockIndex);

    return item;
  }